

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::setup(ShadersOOB *this)

{
  ShaderType SVar1;
  GLuint *pGVar2;
  char *pcVar3;
  undefined1 auVar4 [8];
  GLenum GVar5;
  GLint GVar6;
  GLenum GVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar9;
  ostream *poVar10;
  pointer puVar11;
  TestError *pTVar12;
  pointer pbVar13;
  char *pcVar14;
  long lVar15;
  Functions *gl;
  long lVar16;
  bool bVar17;
  string readWriteStatement;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> refValues;
  ostringstream shaderDecl;
  ostringstream shaderBody;
  ShaderProgram program;
  undefined1 local_830 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_800;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7d8 [2];
  long *local_7c8;
  long local_7c0;
  long local_7b8 [2];
  uint local_7a8;
  undefined4 uStack_7a4;
  value_type local_7a0;
  long *local_780;
  long local_778;
  long local_770 [2];
  long *local_760;
  long local_758;
  long local_750 [2];
  Functions *local_740;
  long *local_738;
  long local_730;
  long local_728 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  long lStack_700;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_688;
  deUint32 local_670;
  undefined1 local_668 [24];
  undefined1 local_650;
  undefined1 local_648 [8];
  pointer pVStack_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638 [6];
  ios_base local_5d8 [272];
  ProgramSources local_4c8;
  undefined1 local_3f8 [384];
  undefined1 local_278 [376];
  ShaderProgram local_100;
  
  gl = (this->super_ContextReset).m_gl;
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"uniform highp int u_index;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "\tuint groupNdx = size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n",0x4b)
    ;
    if (this->m_isLocalArray == true) {
      bVar17 = this->m_isRead;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"\thighp vec4 values = vec4(1.0f) * float(groupNdx);\n",0x33);
      pcVar14 = "\tsb_out.values[u_index] = values.x;\n";
      if (bVar17 != false) {
        pcVar14 = "\tsb_out.values.x = values[u_index];\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar14,0x24);
    }
    else {
      pcVar14 = "sb_in";
      bVar17 = this->m_isUBO != false;
      if (bVar17) {
        pcVar14 = "ub_in";
      }
      pcVar3 = "sb_in";
      if (bVar17) {
        pcVar3 = "ub_in";
      }
      local_648 = (undefined1  [8])local_638;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_648,pcVar14,pcVar3 + 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,"layout(std140, binding = 1) ",0x1c);
      pcVar14 = "buffer";
      if ((ulong)this->m_isUBO != 0) {
        pcVar14 = "uniform";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,pcVar14,(ulong)this->m_isUBO | 6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," Input\n",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,"\thighp vec4 values;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"} ",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,(char *)local_648,(long)pVStack_640);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
      if (this->m_isRead == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_830,"\tsb_out.values.x = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_648);
        plVar8 = (long *)std::__cxx11::string::append(local_830);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_830,"\tsb_out.values[u_index] = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_648);
        plVar8 = (long *)std::__cxx11::string::append(local_830);
      }
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_718.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar13 = (pointer)(plVar8 + 2);
      if ((pointer)*plVar8 == pbVar13) {
        local_718.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
        lStack_700 = plVar8[3];
      }
      else {
        local_718.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
        local_718.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
      }
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
      *plVar8 = (long)pbVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_830._4_4_,local_830._0_4_) != &local_820) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_830._4_4_,local_830._0_4_),
                        local_820._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 (char *)local_718.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)local_718.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      if (local_718.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((local_718.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (local_648 != (undefined1  [8])local_638) {
        operator_delete((void *)local_648,local_638[0]._M_allocated_capacity + 1);
      }
    }
    memset(&local_718,0,0xac);
    local_668._0_8_ = (pointer)0x0;
    local_668[8] = 0;
    local_668._9_7_ = 0;
    local_668[0x10] = 0;
    stack0xfffffffffffff9a9 = 0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"layout(local_size_x = 1, local_size_y = 1) in;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"layout(binding = 0) buffer Output {\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"\thighp vec4 values;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"} sb_out;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"\n",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_648,(char *)local_808,(long)local_800);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main ()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_7c8,local_7c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
    std::ios_base::~ios_base(local_5d8);
    local_830._0_4_ = 5;
    local_830._8_8_ = local_820._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_830 + 8),CONCAT44(uStack_7a4,local_7a8),
               local_7a0._M_dataplus._M_p + CONCAT44(uStack_7a4,local_7a8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_718 + (uint)local_830._0_4_,(value_type *)(local_830 + 8));
    lVar15 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_4c8.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_718.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_4c8.attribLocationBindings,&vStack_688);
    local_4c8.transformFeedbackBufferMode = local_670;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4c8.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_668);
    local_4c8.separable = (bool)local_650;
    if ((char *)local_830._8_8_ != local_820._M_local_buf + 8) {
      operator_delete((void *)local_830._8_8_,local_820._8_8_ + 1);
    }
    if ((size_type *)CONCAT44(uStack_7a4,local_7a8) != &local_7a0._M_string_length) {
      operator_delete((undefined1 *)CONCAT44(uStack_7a4,local_7a8),local_7a0._M_string_length + 1);
    }
    if (local_7c8 != local_7b8) {
      operator_delete(local_7c8,local_7b8[0] + 1);
    }
    if (local_808 != local_7f8) {
      operator_delete(local_808,(ulong)(local_7f8[0]->_M_local_buf + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_668);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&vStack_688);
    lVar15 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_718.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + -0x18;
    } while (lVar15 != -0x18);
    goto LAB_00e43c38;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"uniform highp int u_index;\n",0x1b);
  if (this->m_isLocalArray == true) {
    bVar17 = this->m_isRead;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\thighp vec4 color_out = vec4(1.0f);\n",0x24);
    pcVar14 = "\tcolor[u_index] = color_out.x;\n";
    if (bVar17 != false) {
      pcVar14 = "\tcolor.x = color_out[u_index];\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar14,0x1f);
  }
  else {
    pcVar14 = "sb_in";
    bVar17 = this->m_isUBO != false;
    if (bVar17) {
      pcVar14 = "ub_in";
    }
    pcVar3 = "sb_in";
    if (bVar17) {
      pcVar3 = "ub_in";
    }
    local_648 = (undefined1  [8])local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,pcVar14,pcVar3 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"layout(std140, binding = 0) ",0x1c);
    pcVar14 = "buffer";
    if ((ulong)this->m_isUBO != 0) {
      pcVar14 = "uniform";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,pcVar14,(ulong)this->m_isUBO | 6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," Block\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"\thighp vec4 color_out;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"} ",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f8,(char *)local_648,(long)pVStack_640);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    if (this->m_isRead == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830,
                     "\tcolor.x = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648)
      ;
      plVar8 = (long *)std::__cxx11::string::append(local_830);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830,
                     "\tcolor[u_index] = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648)
      ;
      plVar8 = (long *)std::__cxx11::string::append(local_830);
    }
    local_718.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_718.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar13 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar13) {
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
      lStack_700 = plVar8[3];
    }
    else {
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
    }
    local_718.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
    *plVar8 = (long)pbVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_830._4_4_,local_830._0_4_) != &local_820) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_830._4_4_,local_830._0_4_),
                      local_820._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               (char *)local_718.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (long)local_718.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    if (local_718.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_718.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_718.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_718.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_648 != (undefined1  [8])local_638) {
      operator_delete((void *)local_648,local_638[0]._M_allocated_capacity + 1);
    }
  }
  local_740 = gl;
  memset(&local_718,0,0xac);
  local_668._0_8_ = (pointer)0x0;
  local_668[8] = 0;
  local_668._9_7_ = 0;
  local_668[0x10] = 0;
  stack0xfffffffffffff9a9 = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar1 = (this->super_ContextReset).m_shaderType;
  if (SVar1 == SHADERTYPE_VERT_AND_FRAG) {
LAB_00e43166:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"in highp vec4 a_position;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"out highp vec4 v_color;\n",0x18);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_648,(char *)local_7c8,local_7c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\thighp vec4 color;\n",0x13);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_738,local_730);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tv_color = color;\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tgl_Position = a_position;\n",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
    std::ios_base::~ios_base(local_5d8);
  }
  else if (SVar1 == SHADERTYPE_FRAG) {
    local_808 = local_7f8;
    local_648 = (undefined1  [8])&DAT_0000005a;
    ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)std::__cxx11::string::_M_create((ulong *)&local_808,(ulong)local_648);
    auVar4 = local_648;
    local_7f8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_648;
    local_808 = ppaVar9;
    memcpy(ppaVar9,
           "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
           ,0x5a);
    local_800 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auVar4;
    *(char *)((long)ppaVar9 + (long)auVar4) = '\0';
  }
  else {
    if (SVar1 == SHADERTYPE_VERT) goto LAB_00e43166;
    local_808 = local_7f8;
    local_800 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_7f8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((ulong)local_7f8[0] & 0xffffffffffffff00);
  }
  local_830._0_4_ = 0;
  local_830._8_8_ = local_820._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_830 + 8),local_808,local_800->_M_local_buf + (long)local_808);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_718 + (uint)local_830._0_4_,(value_type *)(local_830 + 8));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar1 = (this->super_ContextReset).m_shaderType;
  if (SVar1 == SHADERTYPE_VERT_AND_FRAG) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"in highp vec4 v_color;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_648,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_648,(char *)local_760,local_758);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\thighp vec4 color = vec4(0.0f);\n",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_780,local_778);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tfragColor = color;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
    std::__cxx11::stringbuf::str();
LAB_00e4365e:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
    std::ios_base::~ios_base(local_5d8);
  }
  else {
    if (SVar1 == SHADERTYPE_FRAG) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_648,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_648,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_648,(char *)local_760,local_758);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"\thighp vec4 color = vec4(0.0f);\n",0x20);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_780,local_778);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tfragColor = color;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
      std::__cxx11::stringbuf::str();
      goto LAB_00e4365e;
    }
    if (SVar1 == SHADERTYPE_VERT) {
      local_7e8 = local_7d8;
      local_648 = (undefined1  [8])0x81;
      ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)std::__cxx11::string::_M_create((ulong *)&local_7e8,(ulong)local_648);
      auVar4 = local_648;
      local_7d8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_648;
      local_7e8 = ppaVar9;
      memcpy(ppaVar9,
             "#version 310 es\nin highp vec4 v_color;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,0x81);
      local_7e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auVar4;
      *(char *)((long)ppaVar9 + (long)auVar4) = '\0';
    }
    else {
      local_7e8 = local_7d8;
      local_7e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_7d8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((ulong)local_7d8[0] & 0xffffffffffffff00);
    }
  }
  local_7a8 = 1;
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a0,local_7e8,local_7e0->_M_local_buf + (long)local_7e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_718 + local_7a8,&local_7a0);
  lVar15 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_4c8.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_4c8.attribLocationBindings,&vStack_688);
  local_4c8.transformFeedbackBufferMode = local_670;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4c8.transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_668);
  local_4c8.separable = (bool)local_650;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  gl = local_740;
  if (local_7e8 != local_7d8) {
    operator_delete(local_7e8,(ulong)(local_7d8[0]->_M_local_buf + 1));
  }
  if (local_780 != local_770) {
    operator_delete(local_780,local_770[0] + 1);
  }
  if (local_760 != local_750) {
    operator_delete(local_760,local_750[0] + 1);
  }
  if ((char *)local_830._8_8_ != local_820._M_local_buf + 8) {
    operator_delete((void *)local_830._8_8_,local_820._8_8_ + 1);
  }
  if (local_808 != local_7f8) {
    operator_delete(local_808,(ulong)(local_7f8[0]->_M_local_buf + 1));
  }
  if (local_738 != local_728) {
    operator_delete(local_738,local_728[0] + 1);
  }
  if (local_7c8 != local_7b8) {
    operator_delete(local_7c8,local_7b8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_668);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_688);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_718.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
LAB_00e43c38:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base((ios_base *)(local_3f8 + 0x70));
  glu::ShaderProgram::ShaderProgram(&local_100,gl,&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4c8.attribLocationBindings);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_4c8.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  glu::operator<<((this->super_ContextReset).m_log,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x50c);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(local_100.m_program.m_program);
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x50e);
  GVar6 = (*((this->super_ContextReset).m_gl)->getUniformLocation)
                    (local_100.m_program.m_program,"u_index");
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x511);
  if (GVar6 == -1) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,"indexLocation != (glw::GLint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x512);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->uniform1i)(GVar6,-1);
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"uniform1i(indexLocation, index)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x515);
  if ((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) {
    local_638[0]._M_allocated_capacity = 0x3f8000003f800000;
    local_638[0]._8_8_ = 0x3f800000bf800000;
    local_648 = (undefined1  [8])0xbf800000bf800000;
    pVStack_640 = (pointer)0xbf8000003f800000;
    GVar6 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                      (local_100.m_program.m_program,"a_position");
    this->m_coordLocation = GVar6;
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x523);
    if (this->m_coordLocation == -1) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x524);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_coordinatesBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"genBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x528);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x529);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,local_648,0x88e4);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,
                    "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52a);
    (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"enableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52b);
    (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
              (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52c);
  }
  local_3f8._0_8_ = (_func_int **)0x3f80000000000000;
  local_3f8._8_8_ = 0x3f8000003f800000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_648,3,
             (value_type *)local_3f8,(allocator_type *)local_278);
  GVar5 = 0x90d2;
  if (this->m_isUBO != false) {
    GVar5 = 0x8a11;
  }
  if (this->m_isLocalArray == false) {
    pGVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*((this->super_ContextReset).m_gl)->genBuffers)
              ((GLsizei)((ulong)((long)(this->m_buffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar2) >>
                        2),pGVar2);
    GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar7,"genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x536);
    puVar11 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_buffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar11) >> 2)) {
      lVar15 = 0;
      lVar16 = 0;
      do {
        (*((this->super_ContextReset).m_gl)->bindBuffer)(GVar5,puVar11[lVar16]);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,"bindBuffer(resType, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53a);
        (*((this->super_ContextReset).m_gl)->bufferData)
                  (GVar5,0x10,(char *)((long)local_648 + lVar15),0x88e4);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,
                        "bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53b);
        (*((this->super_ContextReset).m_gl)->bindBufferBase)
                  (GVar5,(GLuint)lVar16,
                   (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16]);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,"bindBufferBase(resType, bufNdx, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53c);
        lVar16 = lVar16 + 1;
        puVar11 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x10;
      } while (lVar16 < (int)((ulong)((long)(this->m_buffers).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar11) >> 2));
    }
  }
  if (local_648 != (undefined1  [8])0x0) {
    operator_delete((void *)local_648,local_638[0]._M_allocated_capacity - (long)local_648);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void ShadersOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLint indexLocation = m_gl.getUniformLocation(program.getProgram(), "u_index");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(indexLocation != (glw::GLint)-1);

	const glw::GLint index = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(indexLocation, index));

	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		// Setup vertices position
		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	// Create dummy data for filling buffer objects
	const std::vector<tcu::Vec4> refValues(s_numBindings, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f));
	glw::GLenum resType = (m_isUBO) ? GL_UNIFORM_BUFFER : GL_SHADER_STORAGE_BUFFER;

	if (!m_isLocalArray)
	{
		// Set up interface block of buffer bindings
		GLU_CHECK_GLW_CALL(m_gl, genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));

		for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
		{
			GLU_CHECK_GLW_CALL(m_gl, bindBuffer(resType, m_buffers[bufNdx]));
			GLU_CHECK_GLW_CALL(m_gl, bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW));
			GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(resType, bufNdx, m_buffers[bufNdx]));
		}
	}
}